

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdDot<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,wabt::interp::Simd<signed_char,(unsigned_char)16>>
          (Thread *this)

{
  char cVar1;
  char cVar2;
  char cVar3;
  Simd<unsigned_short,_(unsigned_char)__b_> value;
  u8 idx;
  unsigned_short uVar4;
  char *pcVar5;
  unsigned_short *puVar6;
  byte local_41;
  undefined1 auStack_40 [2];
  SL hi;
  SL lo;
  u8 laneidx;
  u8 i;
  Simd<unsigned_short,_(unsigned_char)__b_> result;
  Simd<signed_char,_(unsigned_char)__x10_> lhs;
  Simd<signed_char,_(unsigned_char)__x10_> rhs;
  Thread *this_local;
  
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<signed_char,(unsigned_char)16>>(this);
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<signed_char,(unsigned_char)16>>(this);
  for (local_41 = 0; local_41 < 8; local_41 = local_41 + 1) {
    idx = local_41 * '\x02';
    pcVar5 = Simd<signed_char,_(unsigned_char)'\x10'>::operator[]
                       ((Simd<signed_char,_(unsigned_char)__x10_> *)(result.v + 4),idx);
    cVar1 = *pcVar5;
    pcVar5 = Simd<signed_char,_(unsigned_char)'\x10'>::operator[]
                       ((Simd<signed_char,_(unsigned_char)__x10_> *)(lhs.v + 8),idx);
    cVar2 = *pcVar5;
    pcVar5 = Simd<signed_char,_(unsigned_char)'\x10'>::operator[]
                       ((Simd<signed_char,_(unsigned_char)__x10_> *)(result.v + 4),idx + '\x01');
    cVar3 = *pcVar5;
    pcVar5 = Simd<signed_char,_(unsigned_char)'\x10'>::operator[]
                       ((Simd<signed_char,_(unsigned_char)__x10_> *)(lhs.v + 8),idx + '\x01');
    uVar4 = Add<unsigned_short>((short)cVar1 * (short)cVar2,(short)cVar3 * (short)*pcVar5);
    puVar6 = Simd<unsigned_short,_(unsigned_char)'\b'>::operator[]
                       ((Simd<unsigned_short,_(unsigned_char)__b_> *)auStack_40,local_41);
    *puVar6 = uVar4;
  }
  value.v[4] = result.v[0];
  value.v[5] = result.v[1];
  value.v[6] = result.v[2];
  value.v[7] = result.v[3];
  value.v[0] = (unsigned_short)auStack_40;
  value.v[1] = hi;
  value.v[2] = lo;
  value.v[3] = _laneidx;
  Push<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdDot() {
  using SL = typename S::LaneType;
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    u8 laneidx = i * 2;
    SL lo = SL(lhs[laneidx]) * SL(rhs[laneidx]);
    SL hi = SL(lhs[laneidx + 1]) * SL(rhs[laneidx + 1]);
    result[i] = Add(lo, hi);
  }
  Push(result);
  return RunResult::Ok;
}